

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

_Bool obj_is_useable(object *obj)

{
  _Bool _Var1;
  effect **ppeVar2;
  _Bool _Var3;
  
  _Var1 = tval_is_useable(obj);
  _Var3 = true;
  if (!_Var1) {
    ppeVar2 = &obj->activation->effect;
    if (obj->activation == (activation *)0x0) {
      ppeVar2 = &obj->effect;
    }
    if (*ppeVar2 == (effect *)0x0) {
      _Var1 = tval_is_ammo(obj);
      if (_Var1) {
        _Var3 = (player->state).ammo_tval == (uint)obj->tval;
      }
      else {
        _Var3 = false;
      }
    }
  }
  return _Var3;
}

Assistant:

bool obj_is_useable(const struct object *obj)
{
	if (tval_is_useable(obj))
		return true;

	if (object_effect(obj))
		return true;

	if (tval_is_ammo(obj))
		return obj->tval == player->state.ammo_tval;

	return false;
}